

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::duplicateCols(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  uint _k;
  Nonzero<double> *pNVar2;
  pointer pdVar3;
  DataKey *pDVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  Result RVar8;
  uint uVar9;
  ulong uVar10;
  DuplicateColsPS *pDVar11;
  pointer pDVar12;
  double *pdVar13;
  FixBoundsPS *pFVar14;
  undefined8 extraout_RAX;
  ulong *puVar15;
  undefined8 *puVar16;
  SPxOut *pSVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  Item *pIVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int k;
  int iVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Real RVar30;
  double dVar31;
  ulong extraout_XMM0_Qb;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_6;
  long local_230;
  DataArray<int> da_perm;
  int *perm;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  int *idxMem;
  undefined8 local_1e8;
  ulong uStack_1e0;
  double local_1d8;
  DataArray<bool> remCol;
  IdxSet idxSet;
  DataArray<int> pClass;
  DataArray<bool> fixAndRemCol;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_158;
  DataArray<int> m_perm_empty;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_118;
  Array<double> scale;
  DataArray<int> classSize;
  DataArray<int> local_d8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_70;
  DataArray<int> local_60;
  DataArray<int> local_48;
  
  RVar8 = removeEmpty(this,lp);
  if (RVar8 == OKAY) {
    iVar20 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    RVar8 = OKAY;
    if (1 < iVar20) {
      DataArray<int>::DataArray(&pClass,iVar20,0,1.2);
      DataArray<int>::DataArray
                (&classSize,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,0,
                 1.2);
      Array<double>::Array
                (&scale,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxSet.len = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      iVar20 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      *classSize.data = iVar20;
      for (lVar22 = 1; lVar22 < iVar20; lVar22 = lVar22 + 1) {
        pClass.data[lVar22] = 0;
        scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar22] = 0.0;
        classSize.data[lVar22] = 0;
        lVar23 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxMem[lVar23] = (int)lVar22;
        iVar20 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      psVar1 = &(this->super_SPxSimplifier<double>)._tolerances;
      dVar27 = 0.0;
      for (lVar22 = 0; lVar22 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar22 = lVar22 + 1) {
        pIVar21 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar22].idx;
        lVar23 = 8;
        for (lVar26 = 0; uVar10 = (ulong)(pIVar21->data).super_SVectorBase<double>.memused,
            lVar26 < (long)uVar10; lVar26 = lVar26 + 1) {
          pNVar2 = (pIVar21->data).super_SVectorBase<double>.m_elem;
          dVar28 = *(double *)((long)pNVar2 + lVar23 + -8);
          iVar20 = *(int *)((long)&pNVar2->val + lVar23);
          dVar31 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar20];
          if ((dVar31 == 0.0) && (!NAN(dVar31))) {
            scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar20] = dVar28;
            dVar31 = dVar28;
          }
          remCol._0_8_ = dVar28 / dVar31;
          DSVectorBase<double>::add
                    ((this->m_classSetCols).data.
                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pClass.data[iVar20],iVar20,
                     (double *)&remCol);
          piVar5 = classSize.data + pClass.data[iVar20];
          *piVar5 = *piVar5 + -1;
          if (*piVar5 == 0) {
            lVar19 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar19] = pClass.data[iVar20];
          }
          lVar23 = lVar23 + 0x10;
        }
        for (lVar23 = 0; lVar23 < (int)uVar10; lVar23 = lVar23 + 1) {
          iVar20 = pClass.data[(pIVar21->data).super_SVectorBase<double>.m_elem[lVar23].idx];
          if (0 < (this->m_classSetCols).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar20].super_SVectorBase<double>.
                  memused) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&remCol,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            fixAndRemCol._0_8_ = Tolerances::epsilon((Tolerances *)remCol._0_8_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&remCol.data);
            pDVar12 = (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar25 = pDVar12[iVar20].super_SVectorBase<double>.memused;
            if (1 < iVar25) {
              SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                        (pDVar12[iVar20].super_SVectorBase<double>.m_elem,iVar25,
                         (ElementCompare *)&fixAndRemCol,0,true);
              pDVar12 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar25 = *idxSet.idx;
            lVar26 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar26 + -1];
            lVar26 = 0;
            lVar19 = 0;
            while( true ) {
              if (pDVar12[iVar20].super_SVectorBase<double>.memused <= lVar19) break;
              if (lVar26 != 0) {
                local_1d8 = *(double *)
                             ((long)&(pDVar12[iVar20].super_SVectorBase<double>.m_elem)->val +
                             lVar26);
                dVar28 = epsZero(this);
                bVar6 = NErel<double,double,double>(local_1d8,dVar27,dVar28);
                if (bVar6) {
                  iVar25 = *idxSet.idx;
                  lVar18 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar18 + -1];
                }
              }
              pDVar12 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar2 = pDVar12[iVar20].super_SVectorBase<double>.m_elem;
              pClass.data[*(int *)((long)&pNVar2->idx + lVar26)] = iVar25;
              classSize.data[iVar25] = classSize.data[iVar25] + 1;
              dVar27 = *(double *)((long)&pNVar2->val + lVar26);
              lVar19 = lVar19 + 1;
              lVar26 = lVar26 + 0x10;
            }
            pDVar12[iVar20].super_SVectorBase<double>.memused = 0;
            uVar10 = (ulong)(uint)(pIVar21->data).super_SVectorBase<double>.memused;
          }
        }
      }
      free(idxMem);
      idxMem = (int *)0x0;
      DataArray<bool>::DataArray
                (&remCol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,0,1.2);
      lVar22 = 0;
      DataArray<bool>::DataArray
                (&fixAndRemCol,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,0
                 ,1.2);
      uVar9 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      pDVar12 = (this->m_dupCols).data.
                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      if (0 < (int)uVar9) {
        uVar10 = (ulong)uVar9;
      }
      for (; uVar10 * 0x20 != lVar22; lVar22 = lVar22 + 0x20) {
        *(undefined4 *)((long)&(pDVar12->super_SVectorBase<double>).memused + lVar22) = 0;
      }
      for (lVar22 = 0; lVar22 < (int)uVar9; lVar22 = lVar22 + 1) {
        remCol.data[lVar22] = false;
        fixAndRemCol.data[lVar22] = false;
        m_perm_empty.thesize = 0;
        m_perm_empty.themax = 0;
        DSVectorBase<double>::add
                  ((this->m_dupCols).data.
                   super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pClass.data[lVar22],(int)lVar22,
                   (double *)&m_perm_empty);
        uVar9 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      DataArray<int>::DataArray(&m_perm_empty,0,0,1.2);
      this_00 = &this->m_hist;
      lVar22 = 0;
      bVar6 = false;
      while( true ) {
        lVar23 = (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (lVar23 <= lVar22) break;
        pDVar12 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((1 < pDVar12[lVar22].super_SVectorBase<double>.memused) &&
           ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
            [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
             [(pDVar12[lVar22].super_SVectorBase<double>.m_elem)->idx].idx].data.
            super_SVectorBase<double>.memused != 1)) {
          if (!bVar6) {
            pDVar11 = (DuplicateColsPS *)operator_new(0x78);
            DataArray<int>::DataArray(&local_d8,&m_perm_empty);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_70,
                       &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            DuplicateColsPS::DuplicateColsPS
                      (pDVar11,lp,0,0,1.0,&local_d8,(shared_ptr<soplex::Tolerances> *)&local_70,true
                       ,false);
            std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                      ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        *)&da_perm,pDVar11);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
            DataArray<int>::~DataArray(&local_d8);
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
            ::push_back(&this_00->data,(value_type *)&da_perm);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
            pDVar12 = (this->m_dupCols).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar6 = true;
          }
          local_230 = 0;
          dVar27 = 0.0;
          while ((long)dVar27 < (long)pDVar12[lVar22].super_SVectorBase<double>.memused) {
            lVar26 = 0;
            local_1d8 = dVar27;
            for (lVar19 = 0; lVar19 < pDVar12[lVar22].super_SVectorBase<double>.memused;
                lVar19 = lVar19 + 1) {
              if (local_230 != lVar26) {
                pNVar2 = pDVar12[lVar22].super_SVectorBase<double>.m_elem;
                uVar9 = pNVar2[(long)local_1d8].idx;
                if (remCol.data[(int)uVar9] == false) {
                  _k = *(uint *)((long)&pNVar2->idx + lVar26);
                  if (remCol.data[(int)_k] == false) {
                    pdVar3 = (lp->super_LPColSetBase<double>).object.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    dVar27 = pdVar3[(int)uVar9];
                    dVar28 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar9];
                    dVar31 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)_k];
                    local_1e8 = pdVar3[(int)_k] * dVar28;
                    dVar29 = epsZero(this);
                    dVar28 = dVar28 / dVar31;
                    dVar27 = dVar27 - local_1e8 / dVar31;
                    pdVar3 = (lp->super_LPColSetBase<double>).low.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if (ABS(dVar27) <= dVar29) {
                      dVar27 = pdVar3[(int)uVar9];
                      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                                   &da_perm,&psVar1->
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      RVar30 = Tolerances::epsilon((Tolerances *)da_perm._0_8_);
                      dVar31 = ABS(dVar27);
                      if (dVar31 <= 0.0) {
                        dVar31 = 0.0;
                      }
                      if (dVar31 <= 1.0) {
                        dVar31 = 1.0;
                      }
                      if (dVar27 / dVar31 <= RVar30) {
                        dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[(int)uVar9];
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *
                                     )&ptr_6,&psVar1->
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar30 = Tolerances::epsilon((Tolerances *)
                                                     ptr_6.
                                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                        dVar31 = ABS(dVar27);
                        if (dVar31 <= 0.0) {
                          dVar31 = 0.0;
                        }
                        if (dVar31 <= 1.0) {
                          dVar31 = 1.0;
                        }
                        if (-RVar30 < dVar27 / dVar31) {
                          dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)_k];
                          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        *)&perm,&psVar1->
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          RVar30 = Tolerances::epsilon((Tolerances *)perm);
                          dVar31 = ABS(dVar27);
                          if (dVar31 <= 0.0) {
                            dVar31 = 0.0;
                          }
                          if (dVar31 <= 1.0) {
                            dVar31 = 1.0;
                          }
                          if (dVar27 / dVar31 <= RVar30) {
                            dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)_k];
                            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_158,
                                         &psVar1->
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            RVar30 = Tolerances::epsilon((Tolerances *)
                                                         CONCAT44(local_158._M_ptr._4_4_,
                                                                  local_158._M_ptr._0_4_));
                            dVar31 = ABS(dVar27);
                            if (dVar31 <= 0.0) {
                              dVar31 = 0.0;
                            }
                            if (dVar31 <= 1.0) {
                              dVar31 = 1.0;
                            }
                            local_1e8 = -RVar30;
                            uStack_1e0 = extraout_XMM0_Qb ^ 0x8000000000000000;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_158._M_refcount);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_1f8);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&ptr_6.
                                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
                            if (dVar27 / dVar31 <= local_1e8) goto LAB_001b6fb1;
                            pDVar11 = (DuplicateColsPS *)operator_new(0x78);
                            DataArray<int>::DataArray(&local_48,&m_perm_empty);
                            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_80,
                                         &psVar1->
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            local_1e8._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                            DuplicateColsPS::DuplicateColsPS
                                      (pDVar11,lp,uVar9,_k,dVar28,&local_48,
                                       (shared_ptr<soplex::Tolerances> *)&local_80,false,false);
                            local_1e8 = (double)((ulong)local_1e8._4_4_ << 0x20);
                            std::
                            __shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                            ::__shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                                      ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                        *)&da_perm,pDVar11);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_80._M_refcount);
                            DataArray<int>::~DataArray(&local_48);
                            std::
                            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                            ::push_back(&this_00->data,(value_type *)&da_perm);
                            if (dVar28 <= 0.0) {
                              if (dVar28 < 0.0) {
                                dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                pdVar13 = (double *)infinity();
                                if ((dVar27 <= -*pdVar13) ||
                                   (dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar9],
                                   pdVar13 = (double *)infinity(), *pdVar13 <= dVar27)) {
                                  puVar15 = (ulong *)infinity();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)(*puVar15 ^ 0x8000000000000000);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            ((lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar9] *
                                             dVar28 + (lp->super_LPColSetBase<double>).low.val.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[(int)_k]
                                            );
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                pdVar13 = (double *)infinity();
                                if ((*pdVar13 <= dVar27) ||
                                   (dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar9],
                                   pdVar13 = (double *)infinity(), dVar27 <= -*pdVar13)) {
                                  puVar16 = (undefined8 *)infinity();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)*puVar16;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            (dVar28 * (lp->super_LPColSetBase<double>).low.val.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar9] +
                                            (lp->super_LPColSetBase<double>).up.val.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[(int)_k]);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                              }
                            }
                            else {
                              dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)_k];
                              pdVar13 = (double *)infinity();
                              if ((dVar27 <= -*pdVar13) ||
                                 (dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar9],
                                 pdVar13 = (double *)infinity(), dVar27 <= -*pdVar13)) {
                                puVar15 = (ulong *)infinity();
                                ptr_6.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)(*puVar15 ^ 0x8000000000000000);
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                          (lp,(ulong)_k,&ptr_6,0);
                              }
                              else {
                                pdVar3 = (lp->super_LPColSetBase<double>).low.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                ptr_6.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)
                                          (pdVar3[(int)uVar9] * dVar28 + pdVar3[(int)_k]);
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                          (lp,(ulong)_k,&ptr_6,0);
                              }
                              dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)_k];
                              pdVar13 = (double *)infinity();
                              if ((*pdVar13 <= dVar27) ||
                                 (dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar9],
                                 pdVar13 = (double *)infinity(), *pdVar13 <= dVar27)) {
                                puVar16 = (undefined8 *)infinity();
                                ptr_6.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)*puVar16;
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
                                          (lp,(ulong)_k,&ptr_6,0);
                              }
                              else {
                                pdVar3 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                ptr_6.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)
                                          (dVar28 * pdVar3[(int)uVar9] + pdVar3[(int)_k]);
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
                                          (lp,(ulong)_k,&ptr_6,0);
                              }
                            }
                            remCol.data[(int)uVar9] = true;
                            piVar5 = (this->m_stat).data + 0xe;
                            *piVar5 = *piVar5 + 1;
                            goto LAB_001b6e3e;
                          }
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_1f8);
                        }
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
LAB_001b6e3e:
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
                    }
                    else {
                      local_1e8 = pdVar3[(int)_k];
                      pdVar13 = (double *)infinity();
                      if (local_1e8 <= -*pdVar13) {
                        if ((dVar28 <= 0.0) || (dVar27 <= 0.0)) {
                          if ((0.0 <= dVar28) || (0.0 <= dVar27)) goto LAB_001b6f46;
                          dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)uVar9];
                          pdVar13 = (double *)infinity();
                          if (dVar27 <= -*pdVar13) goto LAB_001b7491;
                          pdVar3 = (lp->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          pFVar14 = (FixBoundsPS *)operator_new(0x30);
                          dVar27 = pdVar3[(int)uVar9];
                          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_a0,
                                       &psVar1->
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          FixBoundsPS::FixBoundsPS
                                    (pFVar14,lp,uVar9,dVar27,
                                     (shared_ptr<soplex::Tolerances> *)&local_a0);
                          std::
                          __shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          ::__shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                    ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                      *)&da_perm,pFVar14);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_a0._M_refcount);
                          std::
                          vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                          ::push_back(&this_00->data,(value_type *)&da_perm);
                          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
                                    (lp,(ulong)uVar9,
                                     (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + (int)uVar9,0);
                        }
                        else {
                          dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)uVar9];
                          pdVar13 = (double *)infinity();
                          if (*pdVar13 <= dVar27) {
LAB_001b7491:
                            if (lVar23 <= lVar22) goto LAB_001b74ab;
                            RVar8 = UNBOUNDED;
                            goto LAB_001b7753;
                          }
                          pdVar3 = (lp->super_LPColSetBase<double>).up.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          pFVar14 = (FixBoundsPS *)operator_new(0x30);
                          dVar27 = pdVar3[(int)uVar9];
                          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_90,
                                       &psVar1->
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          FixBoundsPS::FixBoundsPS
                                    (pFVar14,lp,uVar9,dVar27,
                                     (shared_ptr<soplex::Tolerances> *)&local_90);
                          std::
                          __shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          ::__shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                    ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                      *)&da_perm,pFVar14);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_90._M_refcount);
                          std::
                          vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                          ::push_back(&this_00->data,(value_type *)&da_perm);
                          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                    (lp,(ulong)uVar9,
                                     (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + (int)uVar9,0);
                        }
LAB_001b6f37:
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
                      }
                      else {
                        local_1e8 = (lp->super_LPColSetBase<double>).up.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[(int)_k];
                        pdVar13 = (double *)infinity();
                        if (*pdVar13 <= local_1e8) {
                          if ((0.0 <= dVar28) || (dVar27 <= 0.0)) {
                            if ((dVar28 <= 0.0) || (0.0 <= dVar27)) goto LAB_001b6f46;
                            dVar27 = (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar9];
                            pdVar13 = (double *)infinity();
                            if (dVar27 <= -*pdVar13) goto LAB_001b7491;
                            pdVar3 = (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                            pFVar14 = (FixBoundsPS *)operator_new(0x30);
                            dVar27 = pdVar3[(int)uVar9];
                            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_b0,
                                         &psVar1->
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            FixBoundsPS::FixBoundsPS
                                      (pFVar14,lp,uVar9,dVar27,
                                       (shared_ptr<soplex::Tolerances> *)&local_b0);
                            std::
                            __shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                            ::__shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                      ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                        *)&da_perm,pFVar14);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_b0._M_refcount);
                            std::
                            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                            ::push_back(&this_00->data,(value_type *)&da_perm);
                            (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
                                      (lp,(ulong)uVar9,
                                       (lp->super_LPColSetBase<double>).low.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + (int)uVar9,0);
                          }
                          else {
                            dVar27 = (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar9];
                            pdVar13 = (double *)infinity();
                            if (*pdVar13 <= dVar27) goto LAB_001b7491;
                            pdVar3 = (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                            pFVar14 = (FixBoundsPS *)operator_new(0x30);
                            dVar27 = pdVar3[(int)uVar9];
                            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_118,
                                         &psVar1->
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            FixBoundsPS::FixBoundsPS
                                      (pFVar14,lp,uVar9,dVar27,
                                       (shared_ptr<soplex::Tolerances> *)&local_118);
                            std::
                            __shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                            ::__shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                                      ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                        *)&da_perm,pFVar14);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_118._M_refcount);
                            std::
                            vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                            ::push_back(&this_00->data,(value_type *)&da_perm);
                            (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                      (lp,(ulong)uVar9,
                                       (lp->super_LPColSetBase<double>).up.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + (int)uVar9,0);
                          }
                          goto LAB_001b6f37;
                        }
                      }
LAB_001b6f46:
                      dVar27 = (lp->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[(int)uVar9];
                      dVar28 = (lp->super_LPColSetBase<double>).up.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[(int)uVar9];
                      dVar31 = feastol(this);
                      bVar7 = EQrel<double,double,double>(dVar27,dVar28,dVar31);
                      if (bVar7) {
                        remCol.data[(int)uVar9] = true;
                        fixAndRemCol.data[(int)uVar9] = true;
                        piVar5 = (this->m_stat).data + 0xd;
                        *piVar5 = *piVar5 + 1;
                      }
                    }
                  }
                }
              }
LAB_001b6fb1:
              pDVar12 = (this->m_dupCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar26 = lVar26 + 0x10;
            }
            local_230 = local_230 + 0x10;
            dVar27 = (double)((long)local_1d8 + 1);
          }
        }
        lVar22 = lVar22 + 1;
      }
LAB_001b74ab:
      for (lVar22 = 0; uVar9 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
          lVar22 < (int)uVar9; lVar22 = lVar22 + 1) {
        if (fixAndRemCol.data[lVar22] == true) {
          fixColumn(this,lp,(int)lVar22,false);
        }
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,uVar9);
      pIVar21 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      pDVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
      uVar10 = 0;
      uVar24 = 0;
      if (0 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
      }
      iVar25 = 0;
      iVar20 = 0;
      for (; uVar24 != uVar10; uVar10 = uVar10 + 1) {
        if (remCol.data[uVar10] == true) {
          perm[uVar10] = -1;
          iVar20 = iVar20 + 1;
          iVar25 = iVar25 + pIVar21[pDVar4[uVar10].idx].data.super_SVectorBase<double>.memused;
        }
        else {
          perm[uVar10] = 0;
        }
      }
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x17])(lp,perm);
      piVar5 = (this->m_cIdx).data;
      for (uVar10 = 0; uVar24 != uVar10; uVar10 = uVar10 + 1) {
        if (-1 < (long)perm[uVar10]) {
          piVar5[perm[uVar10]] = piVar5[uVar10];
        }
      }
      DataArray<int>::DataArray(&da_perm,uVar9,0,1.2);
      for (uVar10 = 0; uVar24 != uVar10; uVar10 = uVar10 + 1) {
        da_perm.data[uVar10] = perm[uVar10];
      }
      if (bVar6) {
        pDVar11 = (DuplicateColsPS *)operator_new(0x78);
        DataArray<int>::DataArray(&local_60,&da_perm);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        DuplicateColsPS::DuplicateColsPS
                  (pDVar11,lp,0,0,1.0,&local_60,(shared_ptr<soplex::Tolerances> *)&local_c0,false,
                   true);
        std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<soplex::SPxMainSM<double>::DuplicateColsPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2> *)
                   &ptr_6,pDVar11);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        DataArray<int>::~DataArray(&local_60);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&this_00->data,&ptr_6);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ptr_6.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      free(perm);
      perm = (int *)0x0;
      if (0 < iVar20) {
        piVar5 = &(this->super_SPxSimplifier<double>).m_remCols;
        *piVar5 = *piVar5 + iVar20;
        piVar5 = &(this->super_SPxSimplifier<double>).m_remNzos;
        *piVar5 = *piVar5 + iVar25;
        pSVar17 = (this->super_SPxSimplifier<double>).spxout;
        if ((pSVar17 != (SPxOut *)0x0) && (3 < (int)pSVar17->m_verbosity)) {
          ptr_6.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   CONCAT44(ptr_6.
                            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._4_4_,pSVar17->m_verbosity);
          local_158._M_ptr._0_4_ = 4;
          (*pSVar17->_vptr_SPxOut[2])();
          pSVar17 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                       "Simplifier (duplicate columns) removed ");
          pSVar17 = soplex::operator<<(pSVar17,iVar20);
          pSVar17 = soplex::operator<<(pSVar17," cols, ");
          pSVar17 = soplex::operator<<(pSVar17,iVar25);
          pSVar17 = soplex::operator<<(pSVar17," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
          pSVar17 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar17->_vptr_SPxOut[2])(pSVar17,&ptr_6);
        }
        if ((double)(int)uVar9 * (this->super_SPxSimplifier<double>).m_minReduction < (double)iVar20
           ) {
          *again = true;
        }
      }
      DataArray<int>::~DataArray(&da_perm);
      RVar8 = OKAY;
LAB_001b7753:
      DataArray<int>::~DataArray(&m_perm_empty);
      DataArray<bool>::~DataArray(&fixAndRemCol);
      DataArray<bool>::~DataArray(&remCol);
      IdxSet::~IdxSet(&idxSet);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return RVar8;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}